

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void utime_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req == &utime_req) {
    if (utime_req.result == 0) {
      if (utime_req.fs_type == UV_FS_UTIME) {
        check_utime(*utime_req.data,*(double *)((long)utime_req.data + 8),
                    *(double *)((long)utime_req.data + 0x10));
        uv_fs_req_cleanup(&utime_req);
        utime_cb_count = utime_cb_count + 1;
        return;
      }
      pcVar2 = "req->fs_type == UV_FS_UTIME";
      uVar1 = 0x340;
    }
    else {
      pcVar2 = "req->result == 0";
      uVar1 = 0x33f;
    }
  }
  else {
    pcVar2 = "req == &utime_req";
    uVar1 = 0x33e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void utime_cb(uv_fs_t* req) {
  utime_check_t* c;

  ASSERT(req == &utime_req);
  ASSERT(req->result == 0);
  ASSERT(req->fs_type == UV_FS_UTIME);

  c = req->data;
  check_utime(c->path, c->atime, c->mtime);

  uv_fs_req_cleanup(req);
  utime_cb_count++;
}